

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# part_attr.c
# Opt level: O0

exr_result_t exr_set_name(exr_context_t ctxt,int part_index,char *val)

{
  exr_attribute_t *peVar1;
  size_t __n;
  char *in_RDX;
  uint in_ESI;
  _internal_exr_context *in_RDI;
  exr_attribute_list_t *unaff_retaddr;
  exr_context_t in_stack_00000008;
  _internal_exr_part *part;
  _internal_exr_context *pctxt;
  exr_attribute_t **in_stack_00000020;
  exr_result_t rv;
  exr_attribute_t *attr;
  size_t bytes;
  int32_t in_stack_ffffffffffffffb4;
  _internal_exr_part *d;
  uint in_stack_ffffffffffffffc8;
  exr_result_t eVar2;
  undefined4 in_stack_ffffffffffffffe8;
  _internal_exr_context *p_Var3;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  eVar2 = 0;
  if (in_RDI == (_internal_exr_context *)0x0) {
    eVar2 = 2;
  }
  else {
    p_Var3 = in_RDI;
    internal_exr_lock(in_RDI);
    if (((int)in_ESI < 0) || (in_RDI->num_parts <= (int)in_ESI)) {
      internal_exr_unlock(in_RDI);
      eVar2 = (*in_RDI->print_error)(in_RDI,4,"Part index (%d) out of range",(ulong)in_ESI);
    }
    else {
      d = in_RDI->parts[(int)in_ESI];
      if (in_RDI->mode == '\0') {
        internal_exr_unlock(in_RDI);
        eVar2 = (*in_RDI->standard_error)(in_RDI,8);
      }
      else if (in_RDI->mode == '\x03') {
        internal_exr_unlock(in_RDI);
        eVar2 = (*in_RDI->standard_error)(in_RDI,0x15);
      }
      else {
        if (d->name == (exr_attribute_t *)0x0) {
          eVar2 = exr_attr_list_add(in_stack_00000008,unaff_retaddr,
                                    (char *)CONCAT44(in_stack_fffffffffffffffc,
                                                     in_stack_fffffffffffffff8),
                                    (exr_attribute_type_t)((ulong)p_Var3 >> 0x20),(int32_t)p_Var3,
                                    (uint8_t **)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),
                                    in_stack_00000020);
        }
        else if (d->name->type != EXR_ATTR_STRING) {
          internal_exr_unlock(in_RDI);
          eVar2 = (*in_RDI->print_error)
                            (in_RDI,6,"Invalid required attribute type \'%s\' for \'%s\'",
                             d->name->type_name,"name");
          return eVar2;
        }
        peVar1 = d->name;
        if ((in_RDX == (char *)0x0) || (*in_RDX == '\0')) {
          internal_exr_unlock(in_RDI);
          eVar2 = (*in_RDI->report_error)(in_RDI,3,"Invalid string passed trying to set \'name\'");
        }
        else {
          __n = strlen(in_RDX);
          if (__n < 0x7fffffff) {
            if (eVar2 == 0) {
              if ((((peVar1->field_6).chlist)->num_channels == (int)__n) &&
                 (0 < ((peVar1->field_6).chlist)->num_alloced)) {
                memcpy(((peVar1->field_6).chlist)->entries,in_RDX,__n);
              }
              else {
                if (in_RDI->mode != '\x01') {
                  internal_exr_unlock(in_RDI);
                  eVar2 = (*in_RDI->print_error)
                                    (in_RDI,0x14,
                                     "Existing string \'name\' has length %d, requested %d, unable to change"
                                     ,(ulong)((peVar1->field_6).preview)->width,__n & 0xffffffff);
                  return eVar2;
                }
                eVar2 = exr_attr_string_set_with_length
                                  ((exr_context_t)(ulong)in_stack_ffffffffffffffc8,
                                   (exr_attr_string_t *)in_RDI,(char *)d,in_stack_ffffffffffffffb4);
              }
            }
            internal_exr_unlock(in_RDI);
          }
          else {
            internal_exr_unlock(in_RDI);
            eVar2 = (*in_RDI->print_error)
                              (in_RDI,3,"String too large to store (%lu bytes) into \'name\'",__n);
          }
        }
      }
    }
  }
  return eVar2;
}

Assistant:

exr_result_t
exr_set_name (exr_context_t ctxt, int part_index, const char* val)
{
    size_t bytes;
    REQ_ATTR_FIND_CREATE (name, EXR_ATTR_STRING);

    if (!val || val[0] == '\0')
        return EXR_UNLOCK_AND_RETURN_PCTXT (pctxt->report_error (
            pctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "Invalid string passed trying to set 'name'"));

    bytes = strlen (val);

    if (bytes >= (size_t) INT32_MAX)
        return EXR_UNLOCK_AND_RETURN_PCTXT (pctxt->print_error (
            pctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "String too large to store (%" PRIu64 " bytes) into 'name'",
            (uint64_t) bytes));

    if (rv == EXR_ERR_SUCCESS)
    {
        if (attr->string->length == (int32_t) bytes &&
            attr->string->alloc_size > 0)
        {
            /* we own the string... */
            memcpy (EXR_CONST_CAST (void*, attr->string->str), val, bytes);
        }
        else if (pctxt->mode != EXR_CONTEXT_WRITE)
        {
            return EXR_UNLOCK_AND_RETURN_PCTXT (pctxt->print_error (
                pctxt,
                EXR_ERR_MODIFY_SIZE_CHANGE,
                "Existing string 'name' has length %d, requested %d, unable to change",
                attr->string->length,
                (int32_t) bytes));
        }
        else
        {
            rv = exr_attr_string_set_with_length (
                ctxt, attr->string, val, (int32_t) bytes);
        }
    }

    return EXR_UNLOCK_AND_RETURN_PCTXT (rv);
}